

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadSectors(MapData *map,FMissingTextureTracker *missingtex)

{
  FileReader *pFVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  ulong uVar7;
  short *psVar8;
  ulong *puVar9;
  FDynamicColormap *pFVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  sector_t_conflict *sector;
  ulong uVar14;
  long lVar15;
  short *psVar16;
  FDynamicColormap *local_58;
  FDynamicColormap *local_50;
  int iVar6;
  
  pFVar1 = map->MapLumps[8].Reader;
  if (pFVar1 == (FileReader *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (ulong)(int)pFVar1->Length;
  }
  numsectors = (int)(uVar14 / 0x1a);
  uVar12 = (ulong)numsectors;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar12;
  uVar7 = SUB168(auVar3 * ZEXT816(0x218),0);
  if (SUB168(auVar3 * ZEXT816(0x218),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  sectors = (sector_t_conflict *)operator_new__(uVar7);
  memset(sectors,0,uVar12 * 0x218);
  uVar2 = level.flags >> 0xc;
  psVar8 = (short *)operator_new__(uVar14);
  lVar13 = pFVar1->Length;
  map->file = pFVar1;
  (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,psVar8,(long)(int)lVar13);
  sector = sectors;
  iVar11 = numsectors;
  uVar7 = (ulong)numsectors;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar7;
  uVar14 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0xa0),8) == 0) {
    uVar14 = SUB168(auVar4 * ZEXT816(0xa0),0) | 8;
  }
  puVar9 = (ulong *)operator_new__(uVar14);
  *puVar9 = uVar7;
  if (iVar11 != 0) {
    memset((extsector_t *)(puVar9 + 1),0,((uVar7 * 0xa0 - 0xa0) / 0xa0) * 0xa0 + 0xa0);
  }
  sector->e = (extsector_t *)(puVar9 + 1);
  if (0 < numsectors) {
    lVar15 = 0;
    lVar13 = 0;
    local_50 = (FDynamicColormap *)0x0;
    local_58 = (FDynamicColormap *)0x0;
    psVar16 = psVar8;
    do {
      sector->e = (extsector_t *)((long)&(sectors->e->FakeFloor).Sectors.Array + lVar15);
      if (map->HasBehavior == false) {
        *(byte *)&sector->Flags = (byte)sector->Flags | 4;
      }
      sVar5 = *psVar16;
      sector->planes[0].TexZ = (double)(int)sVar5;
      (sector->floorplane).normal.X = 0.0;
      (sector->floorplane).normal.Y = 0.0;
      (sector->floorplane).normal.Z = 1.0;
      (sector->floorplane).D = -(double)(int)sVar5;
      (sector->floorplane).negiC = -1.0;
      sVar5 = psVar16[1];
      sector->planes[1].TexZ = (double)(int)sVar5;
      (sector->ceilingplane).normal.X = 0.0;
      (sector->ceilingplane).normal.Y = 0.0;
      (sector->ceilingplane).normal.Z = -1.0;
      (sector->ceilingplane).D = (double)(int)sVar5;
      (sector->ceilingplane).negiC = 1.0;
      iVar11 = (int)lVar13;
      SetTexture(sector,iVar11,0,(char *)(psVar16 + 2),missingtex,true);
      SetTexture(sector,iVar11,1,(char *)(psVar16 + 6),missingtex,true);
      sector->lightlevel = psVar16[10];
      sVar5 = psVar16[0xb];
      if (map->HasBehavior == false) {
        iVar6 = P_TranslateSectorSpecial((int)sVar5);
        sVar5 = (short)iVar6;
      }
      sector->special = sVar5;
      FTagManager::AddSectorTag(&tagManager,iVar11,(int)psVar16[0xc]);
      sector->thinglist = (AActor *)0x0;
      sector->touching_thinglist = (msecnode_t *)0x0;
      sector->render_thinglist = (msecnode_t *)0x0;
      sector->touching_renderthings = (msecnode_t *)0x0;
      sector->seqType = ((uVar2 & 1) != 0) - 1;
      (sector->SeqName).super_FName.Index = 0;
      sector->prevsec = -1;
      sector->nextsec = -1;
      sector->planes[0].alpha = 1.0;
      sector->planes[1].alpha = 1.0;
      sector->planes[0].xform.xScale = 1.0;
      sector->planes[0].xform.yScale = 1.0;
      sector->planes[1].xform.xScale = 1.0;
      sector->planes[1].xform.yScale = 1.0;
      sector->heightsec = (sector_t_conflict *)0x0;
      sector->gravity = 1.0;
      sector->ZoneNumber = 0xffff;
      sector->terrainnum[0] = -1;
      sector->terrainnum[1] = -1;
      if ((level.outsidefog == 0xff000000) ||
         ((sector->planes[1].Texture.texnum != skyflatnum.texnum && ((char)sector->special != 'W')))
         ) {
        pFVar10 = local_50;
        if (local_50 == (FDynamicColormap *)0x0) {
          pFVar10 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)level.fadeto,
                                     NormalLight.Desaturate);
          local_50 = pFVar10;
        }
      }
      else {
        pFVar10 = local_58;
        if (local_58 == (FDynamicColormap *)0x0) {
          pFVar10 = GetSpecialLights((PalEntry)0xffffff,(PalEntry)level.outsidefog,0);
          local_58 = pFVar10;
        }
      }
      sector->ColorMap = pFVar10;
      sector->friction = 0.90625;
      sector->movefactor = 0.03125;
      sector->sectornum = iVar11;
      lVar13 = lVar13 + 1;
      sector = sector + 1;
      lVar15 = lVar15 + 0xa0;
      psVar16 = psVar16 + 0xd;
    } while (lVar13 < numsectors);
  }
  operator_delete__(psVar8);
  return;
}

Assistant:

void P_LoadSectors (MapData *map, FMissingTextureTracker &missingtex)
{
	int 				i;
	char				*msp;
	mapsector_t			*ms;
	sector_t*			ss;
	int					defSeqType;
	FDynamicColormap	*fogMap, *normMap;
	int					lumplen = map->Size(ML_SECTORS);

	numsectors = lumplen / sizeof(mapsector_t);
	sectors = new sector_t[numsectors];		
	memset (sectors, 0, numsectors*sizeof(sector_t));

	if (level.flags & LEVEL_SNDSEQTOTALCTRL)
		defSeqType = 0;
	else
		defSeqType = -1;

	fogMap = normMap = NULL;

	msp = new char[lumplen];
	map->Read(ML_SECTORS, msp);
	ms = (mapsector_t*)msp;
	ss = sectors;
	
	// Extended properties
	sectors[0].e = new extsector_t[numsectors];

	for (i = 0; i < numsectors; i++, ss++, ms++)
	{
		ss->e = &sectors[0].e[i];
		if (!map->HasBehavior) ss->Flags |= SECF_FLOORDROP;
		ss->SetPlaneTexZ(sector_t::floor, (double)LittleShort(ms->floorheight));
		ss->floorplane.set(0, 0, 1., -ss->GetPlaneTexZ(sector_t::floor));
		ss->SetPlaneTexZ(sector_t::ceiling, (double)LittleShort(ms->ceilingheight));
		ss->ceilingplane.set(0, 0, -1., ss->GetPlaneTexZ(sector_t::ceiling));
		SetTexture(ss, i, sector_t::floor, ms->floorpic, missingtex, true);
		SetTexture(ss, i, sector_t::ceiling, ms->ceilingpic, missingtex, true);
		ss->lightlevel = LittleShort(ms->lightlevel);
		if (map->HasBehavior)
			ss->special = LittleShort(ms->special);
		else	// [RH] Translate to new sector special
			ss->special = P_TranslateSectorSpecial (LittleShort(ms->special));
		tagManager.AddSectorTag(i, LittleShort(ms->tag));
		ss->thinglist = nullptr;
		ss->touching_thinglist = nullptr;		// phares 3/14/98
		ss->render_thinglist = nullptr;
		ss->touching_renderthings = nullptr;
		ss->seqType = defSeqType;
		ss->SeqName = NAME_None;
		ss->nextsec = -1;	//jff 2/26/98 add fields to support locking out
		ss->prevsec = -1;	// stair retriggering until build completes

		ss->SetAlpha(sector_t::floor, 1.);
		ss->SetAlpha(sector_t::ceiling, 1.);
		ss->SetXScale(sector_t::floor, 1.);	// [RH] floor and ceiling scaling
		ss->SetYScale(sector_t::floor, 1.);
		ss->SetXScale(sector_t::ceiling, 1.);
		ss->SetYScale(sector_t::ceiling, 1.);

		ss->heightsec = NULL;	// sector used to get floor and ceiling height
		// killough 3/7/98: end changes

		ss->gravity = 1.f;	// [RH] Default sector gravity of 1.0
		ss->ZoneNumber = 0xFFFF;
		ss->terrainnum[sector_t::ceiling] = ss->terrainnum[sector_t::floor] = -1;

		// [RH] Sectors default to white light with the default fade.
		//		If they are outside (have a sky ceiling), they use the outside fog.
		if (level.outsidefog != 0xff000000 && (ss->GetTexture(sector_t::ceiling) == skyflatnum || (ss->special&0xff) == Sector_Outside))
		{
			if (fogMap == NULL)
				fogMap = GetSpecialLights (PalEntry (255,255,255), level.outsidefog, 0);
			ss->ColorMap = fogMap;
		}
		else
		{
			if (normMap == NULL)
				normMap = GetSpecialLights (PalEntry (255,255,255), level.fadeto, NormalLight.Desaturate);
			ss->ColorMap = normMap;
		}

		// killough 8/28/98: initialize all sectors to normal friction
		ss->friction = ORIG_FRICTION;
		ss->movefactor = ORIG_FRICTION_FACTOR;
		ss->sectornum = i;
	}
	delete[] msp;
}